

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::split_node
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint index)

{
  node_vec_type *this_00;
  uint *puVar1;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar6;
  void *p;
  float fVar7;
  float fVar8;
  uint i_2;
  uint uVar9;
  int iVar10;
  vq_node *pvVar11;
  uint i;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint min_new_capacity;
  ulong uVar19;
  vq_node *pvVar20;
  float dist2;
  float fVar21;
  float fVar22;
  float dist2_1;
  float fVar23;
  float fVar24;
  vec<6U,_float> new_right_child;
  vec<6U,_float> new_left_child;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vec<6U,_float> result;
  float local_e8 [8];
  float local_c8 [2];
  uint *puStack_c0;
  undefined8 local_b8;
  vq_node *local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  uint64 local_68;
  uint *local_60;
  elemental_vector *local_58;
  elemental_vector *local_50;
  float afStack_48 [6];
  
  pvVar20 = (this->m_nodes).m_p;
  if (pvVar20[index].m_vectors.m_size == 1) {
    return;
  }
  pvVar20 = pvVar20 + index;
  if (this->m_quick == true) {
    compute_split_estimate(this,(vec<6U,_float> *)local_88,(vec<6U,_float> *)local_a8,pvVar20);
  }
  else {
    compute_split_pca(this,(vec<6U,_float> *)local_88,(vec<6U,_float> *)local_a8,pvVar20);
  }
  this_00 = &this->m_nodes;
  iVar12 = 8;
  if (this->m_quick != false) {
    iVar12 = 2;
  }
  local_50 = (elemental_vector *)&this->m_left_children;
  local_58 = (elemental_vector *)&this->m_right_children;
  iVar10 = 0;
  fVar21 = 1e+10;
  local_b0 = pvVar20;
  do {
    if ((this->m_left_children).m_size != 0) {
      (this->m_left_children).m_size = 0;
    }
    if ((this->m_right_children).m_size != 0) {
      (this->m_right_children).m_size = 0;
    }
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    puStack_c0 = (uint *)0x0;
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    if ((pvVar20->m_vectors).m_size == 0) {
LAB_0013c277:
      pvVar20->m_unsplittable = true;
      return;
    }
    fVar7 = 0.0;
    uVar18 = 0;
    uVar17 = 0;
    puVar16 = (uint *)0x0;
    fVar8 = 0.0;
    do {
      puVar5 = (pvVar20->m_vectors).m_p;
      uVar9 = puVar5[uVar18];
      ppVar6 = (this->m_training_vecs).m_p;
      ppVar2 = ppVar6 + uVar9;
      uVar19 = (ulong)ppVar6[uVar9].second;
      fVar22 = 0.0;
      lVar14 = 0;
      do {
        fVar23 = *(float *)(local_88 + lVar14 * 4) - (ppVar2->first).m_s[lVar14];
        fVar22 = fVar22 + fVar23 * fVar23;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      fVar23 = 0.0;
      lVar14 = 0;
      do {
        fVar24 = *(float *)(local_a8 + lVar14 * 4) - (ppVar2->first).m_s[lVar14];
        fVar23 = fVar23 + fVar24 * fVar24;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      if (fVar23 <= fVar22) {
        uVar15 = (this->m_right_children).m_size;
        if ((this->m_right_children).m_capacity <= uVar15) {
          elemental_vector::increase_capacity(local_58,uVar15 + 1,true,4,(object_mover)0x0,false);
          uVar15 = (this->m_right_children).m_size;
          uVar9 = puVar5[uVar18];
          pvVar20 = local_b0;
        }
        (this->m_right_children).m_p[uVar15] = uVar9;
        puVar1 = &(this->m_right_children).m_size;
        *puVar1 = *puVar1 + 1;
        lVar14 = 0;
        do {
          afStack_48[lVar14] = (ppVar2->first).m_s[lVar14] * (float)uVar19;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        lVar14 = 0;
        do {
          local_e8[lVar14] = afStack_48[lVar14] + local_e8[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        fVar22 = (ppVar2->first).m_s[0];
        fVar22 = fVar22 * fVar22;
        lVar14 = 1;
        do {
          fVar23 = (ppVar2->first).m_s[lVar14];
          fVar22 = fVar22 + fVar23 * fVar23;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        puVar16 = (uint *)((long)puVar16 + uVar19);
        fVar8 = fVar8 + fVar22 * (float)uVar19;
      }
      else {
        uVar15 = (this->m_left_children).m_size;
        if ((this->m_left_children).m_capacity <= uVar15) {
          elemental_vector::increase_capacity(local_50,uVar15 + 1,true,4,(object_mover)0x0,false);
          uVar15 = (this->m_left_children).m_size;
          uVar9 = puVar5[uVar18];
          pvVar20 = local_b0;
        }
        (this->m_left_children).m_p[uVar15] = uVar9;
        puVar1 = &(this->m_left_children).m_size;
        *puVar1 = *puVar1 + 1;
        lVar14 = 0;
        do {
          afStack_48[lVar14] = (ppVar2->first).m_s[lVar14] * (float)uVar19;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        lVar14 = 0;
        do {
          local_c8[lVar14] = afStack_48[lVar14] + local_c8[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        fVar22 = (ppVar2->first).m_s[0];
        fVar22 = fVar22 * fVar22;
        lVar14 = 1;
        do {
          fVar23 = (ppVar2->first).m_s[lVar14];
          fVar22 = fVar22 + fVar23 * fVar23;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        uVar17 = uVar17 + uVar19;
        fVar7 = fVar7 + fVar22 * (float)uVar19;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pvVar20->m_vectors).m_size);
    if ((uVar17 == 0) || (puVar16 == (uint *)0x0)) goto LAB_0013c277;
    fVar22 = local_c8[0] * local_c8[0];
    lVar14 = 1;
    do {
      fVar22 = fVar22 + local_c8[lVar14] * local_c8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    fVar7 = fVar7 - fVar22 / (float)uVar17;
    fVar22 = local_e8[0] * local_e8[0];
    lVar14 = 1;
    do {
      fVar22 = fVar22 + local_e8[lVar14] * local_e8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    fVar8 = fVar8 - fVar22 / (float)puVar16;
    lVar14 = 0;
    do {
      local_c8[lVar14] = local_c8[lVar14] * (1.0 / (float)uVar17);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    lVar14 = 0;
    do {
      local_e8[lVar14] = local_e8[lVar14] * (1.0 / (float)puVar16);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    local_88._16_4_ = (uint)local_b8;
    local_88._20_4_ = local_b8._4_4_;
    local_88._0_4_ = local_c8[0];
    local_88._4_4_ = local_c8[1];
    local_88._8_8_ = puStack_c0;
    local_a8._0_4_ = local_e8[0];
    local_a8._4_4_ = local_e8[1];
    local_a8._8_4_ = local_e8[2];
    local_a8._12_4_ = local_e8[3];
    local_a8._16_4_ = local_e8[4];
    local_a8._20_4_ = local_e8[5];
    fVar22 = fVar7 + fVar8;
  } while (((1e-05 <= fVar22) && (0.00125 <= (fVar21 - fVar22) / fVar22)) &&
          (iVar10 = iVar10 + 1, fVar21 = fVar22, iVar10 != iVar12));
  uVar9 = (this->m_nodes).m_size;
  uVar15 = uVar9 + 1;
  pvVar20->m_left = uVar9;
  pvVar20->m_right = uVar15;
  uVar3 = this->m_split_index;
  min_new_capacity = uVar9 + 2;
  pvVar20->m_codebook_index = uVar3;
  this->m_split_index = uVar3 + 1;
  local_68 = uVar17;
  local_60 = puVar16;
  if (uVar9 >> 1 < 0x7fffffff) {
    if ((this->m_nodes).m_capacity < min_new_capacity) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,min_new_capacity,false,0x48,
                 vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover,false);
      uVar4 = (this->m_nodes).m_size;
      uVar13 = min_new_capacity - uVar4;
      if (uVar13 == 0) goto LAB_0013c30a;
      pvVar11 = (this->m_nodes).m_p + uVar4;
      pvVar20 = pvVar11 + uVar13;
    }
    else {
      pvVar11 = this_00->m_p + uVar9;
      pvVar20 = this_00->m_p + (ulong)uVar9 + 2;
    }
    do {
      (pvVar11->m_vectors).m_p = (uint *)0x0;
      (pvVar11->m_vectors).m_size = 0;
      (pvVar11->m_vectors).m_capacity = 0;
      (pvVar11->m_centroid).m_s[0] = 0.0;
      (pvVar11->m_centroid).m_s[1] = 0.0;
      (pvVar11->m_centroid).m_s[2] = 0.0;
      (pvVar11->m_centroid).m_s[3] = 0.0;
      (pvVar11->m_centroid).m_s[4] = 0.0;
      (pvVar11->m_centroid).m_s[5] = 0.0;
      pvVar11->m_total_weight = 0;
      pvVar11->m_left = -1;
      pvVar11->m_right = -1;
      pvVar11->m_codebook_index = -1;
      pvVar11->m_unsplittable = false;
      pvVar11 = pvVar11 + 1;
    } while (pvVar11 != pvVar20);
  }
  else {
    pvVar20 = this_00->m_p;
    lVar14 = 0;
    do {
      p = *(void **)((long)(&pvVar20[min_new_capacity].m_centroid + 1) + lVar14 + 0x10);
      if (p != (void *)0x0) {
        crnlib_free(p);
      }
      lVar14 = lVar14 + 0x48;
    } while (lVar14 != 0x47ffffff70);
  }
LAB_0013c30a:
  (this->m_nodes).m_size = min_new_capacity;
  pvVar11 = (this->m_nodes).m_p;
  pvVar20 = pvVar11 + uVar9;
  if (pvVar20 != (vq_node *)local_88) {
    lVar14 = 0;
    do {
      (pvVar20->m_centroid).m_s[lVar14] = *(float *)(local_88 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
  }
  pvVar11 = pvVar11 + uVar15;
  pvVar20->m_total_weight = local_68;
  puVar16 = (pvVar20->m_vectors).m_p;
  (pvVar20->m_vectors).m_p = (this->m_left_children).m_p;
  (this->m_left_children).m_p = puVar16;
  uVar3 = (pvVar20->m_vectors).m_size;
  (pvVar20->m_vectors).m_size = (this->m_left_children).m_size;
  (this->m_left_children).m_size = uVar3;
  uVar3 = (pvVar20->m_vectors).m_capacity;
  (pvVar20->m_vectors).m_capacity = (this->m_left_children).m_capacity;
  (this->m_left_children).m_capacity = uVar3;
  pvVar20->m_variance = fVar7;
  if ((1 < (pvVar20->m_vectors).m_size) && (0.0 < fVar7)) {
    insert_heap(this,uVar9);
  }
  if (pvVar11 != (vq_node *)local_a8) {
    lVar14 = 0;
    do {
      (pvVar11->m_centroid).m_s[lVar14] = *(float *)(local_a8 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
  }
  pvVar11->m_total_weight = (uint64)local_60;
  puVar16 = (pvVar11->m_vectors).m_p;
  (pvVar11->m_vectors).m_p = (this->m_right_children).m_p;
  (this->m_right_children).m_p = puVar16;
  uVar3 = (pvVar11->m_vectors).m_size;
  (pvVar11->m_vectors).m_size = (this->m_right_children).m_size;
  (this->m_right_children).m_size = uVar3;
  uVar3 = (pvVar11->m_vectors).m_capacity;
  (pvVar11->m_vectors).m_capacity = (this->m_right_children).m_capacity;
  (this->m_right_children).m_capacity = uVar3;
  pvVar11->m_variance = fVar8;
  if ((1 < (pvVar11->m_vectors).m_size) && (0.0 < fVar8)) {
    insert_heap(this,uVar15);
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }